

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

cmInstallRuntimeDependencySet * __thiscall
cmGlobalGenerator::CreateAnonymousRuntimeDependencySet(cmGlobalGenerator *this)

{
  pointer pcVar1;
  cmInstallRuntimeDependencySet *retval;
  __single_object set;
  cmGlobalGenerator *this_local;
  
  set._M_t.
  super___uniq_ptr_impl<cmInstallRuntimeDependencySet,_std::default_delete<cmInstallRuntimeDependencySet>_>
  ._M_t.
  super__Tuple_impl<0UL,_cmInstallRuntimeDependencySet_*,_std::default_delete<cmInstallRuntimeDependencySet>_>
  .super__Head_base<0UL,_cmInstallRuntimeDependencySet_*,_false>._M_head_impl =
       (__uniq_ptr_data<cmInstallRuntimeDependencySet,_std::default_delete<cmInstallRuntimeDependencySet>,_true,_true>
        )(__uniq_ptr_data<cmInstallRuntimeDependencySet,_std::default_delete<cmInstallRuntimeDependencySet>,_true,_true>
          )this;
  std::make_unique<cmInstallRuntimeDependencySet>();
  pcVar1 = std::
           unique_ptr<cmInstallRuntimeDependencySet,_std::default_delete<cmInstallRuntimeDependencySet>_>
           ::get((unique_ptr<cmInstallRuntimeDependencySet,_std::default_delete<cmInstallRuntimeDependencySet>_>
                  *)&retval);
  std::
  vector<std::unique_ptr<cmInstallRuntimeDependencySet,_std::default_delete<cmInstallRuntimeDependencySet>_>,_std::allocator<std::unique_ptr<cmInstallRuntimeDependencySet,_std::default_delete<cmInstallRuntimeDependencySet>_>_>_>
  ::push_back(&this->RuntimeDependencySets,
              (unique_ptr<cmInstallRuntimeDependencySet,_std::default_delete<cmInstallRuntimeDependencySet>_>
               *)&retval);
  std::
  unique_ptr<cmInstallRuntimeDependencySet,_std::default_delete<cmInstallRuntimeDependencySet>_>::
  ~unique_ptr((unique_ptr<cmInstallRuntimeDependencySet,_std::default_delete<cmInstallRuntimeDependencySet>_>
               *)&retval);
  return pcVar1;
}

Assistant:

cmInstallRuntimeDependencySet*
cmGlobalGenerator::CreateAnonymousRuntimeDependencySet()
{
  auto set = cm::make_unique<cmInstallRuntimeDependencySet>();
  auto* retval = set.get();
  this->RuntimeDependencySets.push_back(std::move(set));
  return retval;
}